

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::XThreadEvent::done(XThreadEvent *this)

{
  Executor *pEVar1;
  EventLoop *this_00;
  long lVar2;
  Fault f;
  DebugComparison<const_kj::Executor_*,_const_kj::Executor_*> _kjCondition;
  anon_enum_32 local_14;
  
  pEVar1 = (this->targetExecutor).ptr;
  this_00 = anon_unknown_173::currentEventLoop();
  _kjCondition.right = EventLoop::getExecutor(this_00);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = pEVar1 == _kjCondition.right;
  _kjCondition.left = pEVar1;
  if (!_kjCondition.result) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Executor_const*,kj::Executor_const*>&,char_const(&)[34]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x439,FAILED,"targetExecutor.get() == &currentEventLoop().getExecutor()",
               "_kjCondition,\"calling done() from wrong thread?\"",&_kjCondition,
               (char (*) [34])"calling done() from wrong thread?");
    Debug::Fault::fatal(&f);
  }
  sendReply(this);
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)&_kjCondition,
             (((this->targetExecutor).ptr)->impl).ptr);
  local_14 = this->state;
  if (local_14 == EXECUTING) {
    lVar2 = 0x50;
  }
  else {
    if (local_14 != CANCELING) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34],unsigned_int>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x44a,FAILED,(char *)0x0,"\"can\'t call done() from this state\", (uint)state",
                 (char (*) [34])"can\'t call done() from this state",&local_14);
      Debug::Fault::fatal(&f);
    }
    lVar2 = 0x20;
  }
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
             ((long)&(_kjCondition.right)->_vptr_Executor + lVar2),(char *)this);
  this->state = DONE;
  Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)&_kjCondition);
  return;
}

Assistant:

void XThreadEvent::done() {
  KJ_ASSERT(targetExecutor.get() == &currentEventLoop().getExecutor(),
      "calling done() from wrong thread?");

  sendReply();

  {
    auto lock = targetExecutor->impl->state.lockExclusive();

    switch (state) {
      case EXECUTING:
        lock->executing.remove(*this);
        break;
      case CANCELING:
        // Sending thread requested cancellation, but we're done anyway, so it doesn't matter at this
        // point.
        lock->cancel.remove(*this);
        break;
      default:
        KJ_FAIL_ASSERT("can't call done() from this state", (uint)state);
    }

    setDoneState();
  }
}